

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O3

int nn_req_setopt(nn_sockbase *self,int level,int option,void *optval,size_t optvallen)

{
  int iVar1;
  
  if (option == 1 && level == 0x30) {
    if (optvallen == 4) {
      *(undefined4 *)&self[0x38].vfptr = *optval;
      return 0;
    }
    iVar1 = -0x16;
  }
  else {
    iVar1 = -0x5c;
  }
  return iVar1;
}

Assistant:

int nn_req_setopt (struct nn_sockbase *self, int level, int option,
        const void *optval, size_t optvallen)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    if (level != NN_REQ)
        return -ENOPROTOOPT;

    if (option == NN_REQ_RESEND_IVL) {
        if (nn_slow (optvallen != sizeof (int)))
            return -EINVAL;
        req->resend_ivl = *(int*) optval;
        return 0;
    }

    return -ENOPROTOOPT;
}